

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qconcatenatetablesproxymodel.cpp
# Opt level: O3

void __thiscall
QConcatenateTablesProxyModelPrivate::slotColumnsMoved
          (QConcatenateTablesProxyModelPrivate *this,QModelIndex *sourceParent,int sourceStart,
          int sourceEnd,QModelIndex *destinationParent,int destination)

{
  long in_FS_OFFSET;
  QArrayDataPointer<QPersistentModelIndex> local_28;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  if ((((sourceParent->r < 0) || (sourceParent->c < 0)) ||
      ((sourceParent->m).ptr == (QAbstractItemModel *)0x0)) &&
     (((destinationParent->r < 0 || (destinationParent->c < 0)) ||
      ((destinationParent->m).ptr == (QAbstractItemModel *)0x0)))) {
    local_28.d = (Data *)0x0;
    local_28.ptr = (QPersistentModelIndex *)0x0;
    local_28.size = 0;
    slotSourceLayoutChanged(this,(QList<QPersistentModelIndex> *)&local_28,HorizontalSortHint);
    QArrayDataPointer<QPersistentModelIndex>::~QArrayDataPointer(&local_28);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QConcatenateTablesProxyModelPrivate::slotColumnsMoved(const QModelIndex &sourceParent,
                                                           int sourceStart, int sourceEnd,
                                                           const QModelIndex &destinationParent,
                                                           int destination)
{
    Q_UNUSED(sourceStart)
    Q_UNUSED(sourceEnd)
    Q_UNUSED(destination)
    if (sourceParent.isValid() || destinationParent.isValid())
        return;
    slotSourceLayoutChanged({}, QAbstractItemModel::HorizontalSortHint);
}